

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::BufferSubDataUploadCase::testBufferUpload
          (BufferSubDataUploadCase *this,
          UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          *result,int bufferSize)

{
  code *pcVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  deUint64 dVar5;
  reference pvVar6;
  deUint64 dVar7;
  deUint64 endTime;
  deUint64 startTime;
  Functions *gl;
  int bufferSize_local;
  UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
  *result_local;
  BufferSubDataUploadCase *this_local;
  long lVar4;
  
  pRVar3 = gles3::Context::getRenderContext
                     ((this->
                      super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                      ).
                      super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                      .super_TestCase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x40))
            (0x8892,(this->
                    super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                    ).
                    super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                    .m_bufferID);
  if ((this->m_invalidateBeforeUse & 1U) != 0) {
    (**(code **)(lVar4 + 0x150))
              (0x8892,(long)bufferSize,0,
               (this->
               super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
               ).m_bufferUsage);
  }
  dVar5 = deGetMicroseconds();
  if ((this->m_fullUpload & 1U) == 0) {
    pcVar1 = *(code **)(lVar4 + 0x168);
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&(this->
                         super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                         ).m_zeroData,0);
    (*pcVar1)(0x8892,(long)(bufferSize / 4),(long)(bufferSize / 2),pvVar6);
  }
  else {
    pcVar1 = *(code **)(lVar4 + 0x168);
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&(this->
                         super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                         ).m_zeroData,0);
    (*pcVar1)(0x8892,0,(long)bufferSize,pvVar6);
  }
  dVar7 = deGetMicroseconds();
  (result->duration).totalDuration = dVar7 - dVar5;
  (result->duration).fitResponseDuration = (result->duration).totalDuration;
  if ((this->m_fullUpload & 1U) == 0) {
    result->writtenSize = bufferSize / 2;
  }
  else {
    result->writtenSize = bufferSize;
  }
  return;
}

Assistant:

void BufferSubDataUploadCase::testBufferUpload (UploadSampleResult<SingleOperationDuration>& result, int bufferSize)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bufferID);

	// "invalidate", upload null
	if (m_invalidateBeforeUse)
		gl.bufferData(GL_ARRAY_BUFFER, bufferSize, DE_NULL, m_bufferUsage);

	// upload
	{
		deUint64 startTime;
		deUint64 endTime;

		startTime = deGetMicroseconds();

		if (m_fullUpload)
			gl.bufferSubData(GL_ARRAY_BUFFER, 0, bufferSize, &m_zeroData[0]);
		else
		{
			// upload to buffer center
			gl.bufferSubData(GL_ARRAY_BUFFER, bufferSize / 4, bufferSize / 2, &m_zeroData[0]);
		}

		endTime = deGetMicroseconds();

		result.duration.totalDuration = endTime - startTime;
		result.duration.fitResponseDuration = result.duration.totalDuration;

		if (m_fullUpload)
			result.writtenSize = bufferSize;
		else
			result.writtenSize = bufferSize / 2;
	}
}